

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::executeLargePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestStatus *pTVar1;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::Handle<(vk::HandleType)10>_> *ptr;
  long lVar3;
  int iVar4;
  bool bVar5;
  allocator<char> local_1b1;
  TestStatus *local_1b0;
  VkDevice local_1a8;
  VkQueue local_1a0;
  string local_198;
  RefBase<vk::VkCommandBuffer_s_*> local_178;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  events;
  undefined1 local_140 [40];
  RefBase<vk::Handle<(vk::HandleType)6>_> local_118;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_f8;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  
  local_1b0 = __return_storage_ptr__;
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_1a0 = Context::getUniversalQueue(context);
  cmdPoolParams.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  local_f8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_f8.m_data.object.m_internal = submitInfo._0_8_;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = local_f8.m_data.object.m_internal;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  local_1a8 = device;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,&cmdBufParams);
  local_178.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_178.m_data.deleter.m_pool.m_internal = (deUint64)submitInfo.pWaitSemaphores;
  local_178.m_data.object = (VkCommandBuffer_s *)submitInfo._0_8_;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  primCmdBufBeginInfo.flags = 0;
  primCmdBufBeginInfo._20_4_ = 0;
  primCmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  primCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  primCmdBufBeginInfo._4_4_ = 0;
  primCmdBufBeginInfo.pNext = (void *)0x0;
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  events.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 10000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    ptr = (Unique<vk::Handle<(vk::HandleType)10>_> *)operator_new(0x20);
    ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&submitInfo,vk,local_1a8,0,
                      (VkAllocationCallbacks *)0x0);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_device =
         (VkDevice)submitInfo._16_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.object.m_internal =
         submitInfo._0_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)10>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)submitInfo.pNext;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)local_140,ptr)
    ;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
                *)&events,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)local_140);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)local_140);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&submitInfo);
  }
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_178.m_data.object,&primCmdBufBeginInfo);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3c2);
  for (lVar3 = 0; lVar3 != 160000; lVar3 = lVar3 + 0x10) {
    (*vk->_vptr_DeviceInterface[0x6a])
              (vk,local_178.m_data.object,
               **(undefined8 **)
                 ((long)&(events.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar3),0x10000);
  }
  VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_178.m_data.object);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3ca);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,local_1a8,0,
                    (VkAllocationCallbacks *)0x0);
  local_118.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_118.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_118.m_data.object.m_internal = submitInfo._0_8_;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_178;
  VVar2 = (*vk->_vptr_DeviceInterface[2])
                    (vk,local_1a0,1,&submitInfo,local_118.m_data.object.m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3dd);
  VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,local_1a8,1,&local_118,0,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x3e0);
  tcu::TestStatus::incomplete();
  lVar3 = 0;
  do {
    if (lVar3 + 0x10 == 0x27110) goto LAB_0048b8b2;
    iVar4 = (*vk->_vptr_DeviceInterface[0x1b])
                      (vk,local_1a8,
                       **(undefined8 **)
                         ((long)&(events.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar3));
    lVar3 = lVar3 + 0x10;
  } while (iVar4 == 3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"An event was not set.",&local_1b1);
  pTVar1 = local_1b0;
  tcu::TestStatus::fail((TestStatus *)local_140,&local_198);
  tcu::TestStatus::operator=(pTVar1,(TestStatus *)local_140);
  std::__cxx11::string::~string((string *)(local_140 + 8));
  std::__cxx11::string::~string((string *)&local_198);
LAB_0048b8b2:
  pTVar1 = local_1b0;
  if (local_1b0->m_code == QP_TEST_RESULT_LAST) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"All events set correctly.",&local_1b1);
    tcu::TestStatus::pass((TestStatus *)local_140,&local_198);
    tcu::TestStatus::operator=(pTVar1,(TestStatus *)local_140);
    std::__cxx11::string::~string((string *)(local_140 + 8));
    std::__cxx11::string::~string((string *)&local_198);
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_118);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ::~vector(&events);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_178);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_f8);
  return pTVar1;
}

Assistant:

tcu::TestStatus executeLargePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const deUint32							LARGE_BUFFER_SIZE		= 10000;

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkEventSp>					events;
	for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
		events.push_back(VkEventSp(new vk::Unique<VkEvent>(createEvent(vk, vkDevice))));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// set all the events
		for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
		{
			vk.cmdSetEvent(*primCmdBuf, events[ndx]->get(), VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
		}
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// Submit the command buffer to the queue
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

	// check if the buffer was executed correctly - all events had their status
	// changed
	tcu::TestStatus testResult = tcu::TestStatus::incomplete();

	for (deUint32 ndx = 0; ndx < LARGE_BUFFER_SIZE; ++ndx)
	{
		if (vk.getEventStatus(vkDevice, events[ndx]->get()) != VK_EVENT_SET)
		{
			testResult = tcu::TestStatus::fail("An event was not set.");
			break;
		}
	}

	if (!testResult.isComplete())
		testResult = tcu::TestStatus::pass("All events set correctly.");

	return testResult;
}